

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMain.cpp
# Opt level: O0

void Test::printHelp(string *progName)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  reference __args_1;
  reference ppVar4;
  char *pcVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>
  *pair;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
  *__range1_1;
  SuiteEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<Test::SuiteEntry,_std::allocator<Test::SuiteEntry>_> *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
  sortedSuites;
  string *progName_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Runs the test-suites. The list of all available test-suites can be found beneath. Passing no argument runs all suites marked with \'(default)\'."
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Run with \'");
  poVar3 = std::operator<<(poVar3,(string *)progName);
  poVar3 = std::operator<<(poVar3," [options]\'");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setw(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3,"--help");
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"Prints this help");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setw(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3,"--list-tests[=<file>]");
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Prints the list of test methods to the given output file or the standard output. Does not actually run any tests"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setw(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3,"--test-pattern=<pattern>");
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Runs only the test methods matching the given simplified glob pattern. Only full matches and wildcard (via \'*\') matching is supported."
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setw(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3," ");
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Can be repeated to include test-methods matching any of the given patterns."
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setw(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3,"--output=val");
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Sets the output of the tests. Available options are: plain, colored, gcc, msvc, generic, junit. Defaults to \'plain\'"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setw(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3,"-o=val");
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "\'plain\' prints simple text, \'colored\' uses console colors, \'gcc\', \'msvc\' and \'generic\' use compiler-like output syntax"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setw(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3,"--mode=val");
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Sets the output mode to one of \'debug\', \'verbose\', \'terse\' in order of the amount of information printed. Defaults to \'terse\'"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sortedSuites._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = std::setw(0x1e);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           sortedSuites._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  poVar3 = std::operator<<(poVar3,"--output-file=file");
  sortedSuites._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = std::setw(4);
  poVar3 = std::operator<<(poVar3,sortedSuites._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                  _0_4_);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,
                           "Sets the optional output file to write to, defaults to \'stdout\'. \'colored\' output can only write to console!"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Test suites:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
         *)&__range1);
  __end1 = std::vector<Test::SuiteEntry,_std::allocator<Test::SuiteEntry>_>::begin
                     ((vector<Test::SuiteEntry,_std::allocator<Test::SuiteEntry>_> *)availableSuites
                     );
  entry = (SuiteEntry *)
          std::vector<Test::SuiteEntry,_std::allocator<Test::SuiteEntry>_>::end
                    ((vector<Test::SuiteEntry,_std::allocator<Test::SuiteEntry>_> *)availableSuites)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Test::SuiteEntry_*,_std::vector<Test::SuiteEntry,_std::allocator<Test::SuiteEntry>_>_>
                                *)&entry);
    if (!bVar1) break;
    __args_1 = __gnu_cxx::
               __normal_iterator<Test::SuiteEntry_*,_std::vector<Test::SuiteEntry,_std::allocator<Test::SuiteEntry>_>_>
               ::operator*(&__end1);
    std::
    map<std::__cxx11::string,Test::SuiteEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>>
    ::emplace<std::__cxx11::string_const&,Test::SuiteEntry_const&>
              ((map<std::__cxx11::string,Test::SuiteEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>>
                *)&__range1,&__args_1->name,__args_1);
    __gnu_cxx::
    __normal_iterator<Test::SuiteEntry_*,_std::vector<Test::SuiteEntry,_std::allocator<Test::SuiteEntry>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
                      *)&__range1);
  pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
                   *)&__range1);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&pair);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>
             ::operator*(&__end1_1);
    _Var2 = std::setw(0x1e);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = std::operator<<(poVar3,(string *)ppVar4);
    _Var2 = std::setw(4);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)&(ppVar4->second).description);
    bVar1 = SuiteEntry::has(&ppVar4->second,OMIT_FROM_DEFAULT);
    pcVar5 = " (default)";
    if (bVar1) {
      pcVar5 = "";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>
    ::operator++(&__end1_1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
          *)&__range1);
  return;
}

Assistant:

void printHelp(const std::string &progName) {
    static const int paramWidth = 30;
    static const int gapWidth = 4;
    std::cout << "Runs the test-suites. The list of all available test-suites can be found beneath. Passing no "
                 "argument runs all suites marked with '(default)'."
              << std::endl;
    std::cout << "Run with '" << progName << " [options]'" << std::endl;
    std::cout << std::endl;
    std::cout << std::setw(paramWidth) << "--help" << std::setw(gapWidth) << " " << "Prints this help" << std::endl;
    std::cout << std::setw(paramWidth) << "--list-tests[=<file>]" << std::setw(gapWidth) << " "
              << "Prints the list of test methods to the given output file or the standard output. Does not actually "
                 "run any tests"
              << std::endl;
    std::cout << std::setw(paramWidth) << "--test-pattern=<pattern>" << std::setw(gapWidth) << " "
              << "Runs only the test methods matching the given simplified glob pattern. Only full matches and "
                 "wildcard (via '*') matching is supported."
              << std::endl;
    std::cout << std::setw(paramWidth) << " " << std::setw(gapWidth) << " "
              << "Can be repeated to include test-methods matching any of the given patterns." << std::endl;
    std::cout << std::setw(paramWidth) << "--output=val" << std::setw(gapWidth) << " "
              << "Sets the output of the tests. Available options are: plain, colored, gcc, msvc, generic, junit. "
                 "Defaults to 'plain'"
              << std::endl;
    std::cout << std::setw(paramWidth) << "-o=val" << std::setw(gapWidth) << " "
              << "'plain' prints simple text, 'colored' uses console colors, 'gcc', 'msvc' and 'generic' use "
                 "compiler-like output syntax"
              << std::endl;
    std::cout << std::setw(paramWidth) << "--mode=val" << std::setw(gapWidth) << " "
              << "Sets the output mode to one of 'debug', 'verbose', 'terse' in order of the amount of information "
                 "printed. Defaults to 'terse'"
              << std::endl;
    std::cout << std::setw(paramWidth) << "--output-file=file" << std::setw(gapWidth) << " "
              << "Sets the optional output file to write to, defaults to 'stdout'. 'colored' output can only write to "
                 "console!"
              << std::endl;
    std::cout << std::endl;
    std::cout << "Test suites:" << std::endl;
    // sort suites by name
    std::map<std::string, SuiteEntry> sortedSuites;
    for (const auto &entry : availableSuites)
      sortedSuites.emplace(entry.name, entry);
    for (const auto &pair : sortedSuites) {
      std::cout << std::setw(paramWidth) << pair.first << std::setw(gapWidth) << " " << pair.second.description
                << (pair.second.has(RegistrationFlags::OMIT_FROM_DEFAULT) ? "" : " (default)") << std::endl;
    }
  }